

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Ptr_AbcDeriveOutputs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  char *Entry;
  Vec_Ptr_t *vSigs;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkPoNum(pNtk);
  p = Vec_PtrAllocExact(iVar1);
  for (vSigs._4_4_ = 0; iVar1 = Abc_NtkPoNum(pNtk), vSigs._4_4_ < iVar1;
      vSigs._4_4_ = vSigs._4_4_ + 1) {
    pObj_00 = Abc_NtkPo(pNtk,vSigs._4_4_);
    Entry = Ptr_AbcObjName(pObj_00);
    Vec_PtrPush(p,Entry);
  }
  iVar1 = Ptr_CheckArray(p);
  if (iVar1 == 0) {
    __assert_fail("Ptr_CheckArray(vSigs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0xb4,"Vec_Ptr_t *Ptr_AbcDeriveOutputs(Abc_Ntk_t *)");
  }
  return p;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveOutputs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( vSigs, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}